

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

List<Kernel::Formula_*> * Lib::List<Kernel::Formula_*>::reverse(List<Kernel::Formula_*> *l)

{
  List<Kernel::Formula_*> *pLVar1;
  List<Kernel::Formula_*> *pLVar2;
  
  pLVar2 = (List<Kernel::Formula_*> *)0x0;
  if (l != (List<Kernel::Formula_*> *)0x0) {
    while (l != (List<Kernel::Formula_*> *)0x0) {
      pLVar1 = l->_tail;
      l->_tail = pLVar2;
      pLVar2 = l;
      l = pLVar1;
    }
  }
  return pLVar2;
}

Assistant:

static List* reverse(List* l)
  {
    if (isEmpty(l)) return empty();

    List* result = empty();

    while (isNonEmpty(l)) {
      List* tl = l->tail();
      l->setTail(result);
      result = l;
      l = tl;
    }

    return result;
  }